

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zutil.c
# Opt level: O3

void zinf_norm_error(int nrhs,SuperMatrix *X,doublecomplex *xtrue)

{
  int *piVar1;
  long lVar2;
  int iVar3;
  long lVar4;
  doublecomplex *pdVar5;
  doublecomplex *z;
  double dVar6;
  double local_78;
  double local_70;
  doublecomplex local_48;
  
  if (0 < nrhs) {
    piVar1 = (int *)X->Store;
    lVar2 = *(long *)(piVar1 + 2);
    iVar3 = 0;
    do {
      local_70 = NAN;
      if (0 < X->nrow) {
        z = (doublecomplex *)((long)(*piVar1 * iVar3) * 0x10 + lVar2);
        local_70 = 0.0;
        lVar4 = 0;
        local_78 = 0.0;
        pdVar5 = xtrue;
        do {
          local_48.r = z->r - pdVar5->r;
          local_48.i = z->i - pdVar5->i;
          dVar6 = z_abs(&local_48);
          if (local_70 <= dVar6) {
            local_70 = z_abs(&local_48);
          }
          dVar6 = z_abs(z);
          if (local_78 <= dVar6) {
            local_78 = z_abs(z);
          }
          lVar4 = lVar4 + 1;
          pdVar5 = pdVar5 + 1;
          z = z + 1;
        } while (lVar4 < X->nrow);
        local_70 = local_70 / local_78;
      }
      printf("||X - Xtrue||/||X|| = %e\n",local_70);
      iVar3 = iVar3 + 1;
    } while (iVar3 != nrhs);
  }
  return;
}

Assistant:

void zinf_norm_error(int nrhs, SuperMatrix *X, doublecomplex *xtrue)
{
    DNformat *Xstore;
    double err, xnorm;
    doublecomplex *Xmat, *soln_work;
    doublecomplex temp;
    int i, j;

    Xstore = X->Store;
    Xmat = Xstore->nzval;

    for (j = 0; j < nrhs; j++) {
      soln_work = &Xmat[j*Xstore->lda];
      err = xnorm = 0.0;
      for (i = 0; i < X->nrow; i++) {
        z_sub(&temp, &soln_work[i], &xtrue[i]);
	err = SUPERLU_MAX(err, z_abs(&temp));
	xnorm = SUPERLU_MAX(xnorm, z_abs(&soln_work[i]));
      }
      err = err / xnorm;
      printf("||X - Xtrue||/||X|| = %e\n", err);
    }
}